

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O1

TRef fold_abc_fwd(jit_State *J)

{
  IRIns *pIVar1;
  uint uVar2;
  bool bVar3;
  TRef TVar4;
  ushort uVar5;
  ulong uVar6;
  ushort uVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  
  TVar4 = 0;
  if (((J->flags & 0x800000) != 0) && (lVar8 = (long)(short)(J->fold).right.field_0.op2, -1 < lVar8)
     ) {
    pIVar1 = (J->cur).ir;
    uVar6 = (ulong)(J->fold).right.field_0.op1;
    if ((*(char *)((long)pIVar1 + uVar6 * 8 + 5) == '(') &&
       ((lVar10 = (long)*(short *)((long)pIVar1 + uVar6 * 8 + 2), -1 < lVar10 &&
        (pIVar1[lVar8].field_1.op12 + pIVar1[lVar10].field_1.op12 == 0)))) {
      uVar9 = (J->fold).ins.field_1.op12;
      uVar7 = (ushort)uVar9;
      uVar5 = (ushort)pIVar1[uVar6].field_1.op12;
      uVar2 = pIVar1[uVar6].field_1.op12;
      if (uVar5 < uVar7) {
        uVar2 = uVar9;
      }
      uVar9 = (uint)J->chain[10];
      do {
        if (uVar9 <= (uVar2 & 0xffff)) {
          return 0;
        }
        uVar6 = (ulong)uVar9;
        if ((pIVar1[uVar6].field_0.op1 == uVar7) &&
           (*(ushort *)((long)pIVar1 + uVar6 * 8 + 2) == uVar5)) {
          bVar3 = false;
        }
        else {
          uVar9 = (uint)*(ushort *)((long)pIVar1 + uVar6 * 8 + 6);
          bVar3 = true;
        }
      } while (bVar3);
      TVar4 = 4;
    }
  }
  return TVar4;
}

Assistant:

LJFOLD(ABC any ADD)
LJFOLDF(abc_fwd)
{
  if (LJ_LIKELY(J->flags & JIT_F_OPT_ABC)) {
    if (irref_isk(fright->op2)) {
      IRIns *add2 = IR(fright->op1);
      if (add2->o == IR_ADD && irref_isk(add2->op2) &&
	  IR(fright->op2)->i == -IR(add2->op2)->i) {
	IRRef ref = J->chain[IR_ABC];
	IRRef lim = add2->op1;
	if (fins->op1 > lim) lim = fins->op1;
	while (ref > lim) {
	  IRIns *ir = IR(ref);
	  if (ir->op1 == fins->op1 && ir->op2 == add2->op1)
	    return DROPFOLD;
	  ref = ir->prev;
	}
      }
    }
  }
  return NEXTFOLD;
}